

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::PrintWithFallback<(anonymous_namespace)::KtxTexture<ktxTexture2>>
               (KtxTexture<ktxTexture2> *value,ostream *os)

{
  KtxTexture<ktxTexture2> *in_RSI;
  ostream *in_stack_ffffffffffffffe8;
  
  internal_stream_operator_without_lexical_name_lookup::StreamPrinter::
  PrintValue<(anonymous_namespace)::KtxTexture<ktxTexture2>,void,std::ostream&>
            (in_RSI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

void PrintWithFallback(const T& value, ::std::ostream* os) {
  using Printer = typename FindFirstPrinter<
      T, void, ContainerPrinter, FunctionPointerPrinter, PointerPrinter,
      internal_stream_operator_without_lexical_name_lookup::StreamPrinter,
      ProtobufPrinter, ConvertibleToIntegerPrinter,
      ConvertibleToStringViewPrinter, RawBytesPrinter, FallbackPrinter>::type;
  Printer::PrintValue(value, os);
}